

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O1

int TRUST_TOKEN_CLIENT_set_srr_key(TRUST_TOKEN_CLIENT *ctx,EVP_PKEY *key)

{
  if (ctx->method->has_srr != 0) {
    EVP_PKEY_free((EVP_PKEY *)ctx->srr_key);
    EVP_PKEY_up_ref(key);
    ctx->srr_key = key;
  }
  return 1;
}

Assistant:

int TRUST_TOKEN_CLIENT_set_srr_key(TRUST_TOKEN_CLIENT *ctx, EVP_PKEY *key) {
  if (!ctx->method->has_srr) {
    return 1;
  }
  EVP_PKEY_free(ctx->srr_key);
  EVP_PKEY_up_ref(key);
  ctx->srr_key = key;
  return 1;
}